

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jmespath.hpp
# Opt level: O1

reference __thiscall
jsoncons::jmespath::detail::
jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
flatten_projection::evaluate
          (flatten_projection *this,reference val,
          eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
          *context,error_code *ec)

{
  pointer ppeVar1;
  bool bVar2;
  int iVar3;
  basic_json<char,jsoncons::sorted_policy,std::allocator<char>> *this_00;
  undefined4 extraout_var;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *this_01;
  reference pbVar5;
  reference elem;
  iterator this_02;
  expr_base_impl<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
  **expression;
  pointer ppeVar6;
  iterator iVar7;
  const_array_range_type cVar8;
  const_array_range_type cVar9;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *local_58;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *local_50;
  flatten_projection *local_48;
  iterator local_40;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *local_38;
  iterator iVar4;
  undefined4 extraout_var_00;
  
  local_48 = this;
  bVar2 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_array(val);
  if (bVar2) {
    this_00 = (basic_json<char,jsoncons::sorted_policy,std::allocator<char>> *)
              eval_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
              ::create_json<jsoncons::json_array_arg_t_const&>
                        ((eval_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
                          *)context,(json_array_arg_t *)&json_array_arg);
    cVar8 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::array_range(val);
    if (cVar8.first_._M_current._M_current != cVar8.last_._M_current._M_current) {
      do {
        local_40 = cVar8.last_._M_current;
        iVar4 = cVar8.first_._M_current;
        bVar2 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_array
                          (iVar4._M_current);
        local_50 = iVar4._M_current;
        if (bVar2) {
          cVar9 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::array_range
                            (iVar4._M_current);
          iVar4._M_current = cVar9.last_._M_current._M_current;
          if (cVar9.first_._M_current._M_current != cVar9.last_._M_current._M_current) {
            do {
              local_38 = iVar4._M_current;
              iVar7 = cVar9.last_._M_current;
              this_02 = cVar9.first_._M_current;
              bVar2 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_null
                                (this_02._M_current);
              if (!bVar2) {
                ppeVar1 = (local_48->super_projection_base).expressions_.
                          super__Vector_base<jsoncons::jmespath::expr_base_impl<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::allocator<jsoncons::jmespath::expr_base_impl<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
                iVar4._M_current = this_02._M_current;
                for (ppeVar6 = (local_48->super_projection_base).expressions_.
                               super__Vector_base<jsoncons::jmespath::expr_base_impl<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::allocator<jsoncons::jmespath::expr_base_impl<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*>_>
                               ._M_impl.super__Vector_impl_data._M_start; ppeVar6 != ppeVar1;
                    ppeVar6 = ppeVar6 + 1) {
                  iVar3 = (*((*ppeVar6)->
                            super_expr_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                            )._vptr_expr_base[2])(*ppeVar6,iVar4._M_current,context,ec);
                  iVar4._M_current =
                       (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                       CONCAT44(extraout_var,iVar3);
                }
                bVar2 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_null
                                  (iVar4._M_current);
                iVar7._M_current = local_38;
                if (!bVar2) {
                  local_58 = iVar4._M_current;
                  basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::
                  emplace_back<jsoncons::json_const_pointer_arg_t_const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const*>
                            (this_00,(json_const_pointer_arg_t *)&json_const_pointer_arg,&local_58);
                }
              }
              cVar9.last_._M_current = iVar7._M_current;
              cVar9.first_._M_current = this_02._M_current + 1;
              iVar4._M_current = local_38;
            } while (this_02._M_current + 1 != iVar7._M_current);
          }
        }
        else {
          bVar2 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_null
                            (iVar4._M_current);
          if (!bVar2) {
            ppeVar1 = (local_48->super_projection_base).expressions_.
                      super__Vector_base<jsoncons::jmespath::expr_base_impl<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::allocator<jsoncons::jmespath::expr_base_impl<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            this_01 = local_50;
            for (ppeVar6 = (local_48->super_projection_base).expressions_.
                           super__Vector_base<jsoncons::jmespath::expr_base_impl<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::allocator<jsoncons::jmespath::expr_base_impl<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*>_>
                           ._M_impl.super__Vector_impl_data._M_start; ppeVar6 != ppeVar1;
                ppeVar6 = ppeVar6 + 1) {
              iVar3 = (*((*ppeVar6)->
                        super_expr_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                        )._vptr_expr_base[2])(*ppeVar6,this_01,context,ec);
              this_01 = (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                        CONCAT44(extraout_var_00,iVar3);
            }
            bVar2 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_null
                              (this_01);
            if (!bVar2) {
              local_58 = this_01;
              basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::
              emplace_back<jsoncons::json_const_pointer_arg_t_const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const*>
                        (this_00,(json_const_pointer_arg_t *)&json_const_pointer_arg,&local_58);
            }
          }
        }
        cVar8.last_._M_current = local_40._M_current;
        cVar8.first_._M_current = local_50 + 1;
      } while (local_50 + 1 != local_40._M_current);
    }
    return (reference)this_00;
  }
  pbVar5 = eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
           ::null_value(context);
  return pbVar5;
}

Assistant:

reference evaluate(reference val, eval_context<Json>& context, std::error_code& ec) const override
            {
                if (!val.is_array())
                {
                    return context.null_value();
                }

                auto result = context.create_json(json_array_arg);
                for (reference current_elem : val.array_range())
                {
                    if (current_elem.is_array())
                    {
                        for (reference elem : current_elem.array_range())
                        {
                            if (!elem.is_null())
                            {
                                reference j = this->apply_expressions(elem, context, ec);
                                if (!j.is_null())
                                {
                                    result->emplace_back(json_const_pointer_arg, std::addressof(j));
                                }
                            }
                        }
                    }
                    else
                    {
                        if (!current_elem.is_null())
                        {
                            reference j = this->apply_expressions(current_elem, context, ec);
                            if (!j.is_null())
                            {
                                result->emplace_back(json_const_pointer_arg, std::addressof(j));
                            }
                        }
                    }
                }
                return *result;
            }